

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O1

DdNode * Llb_ManCreateConstraints(Llb_Man_t *p,Vec_Int_t *vHints,int fUseNsVars)

{
  int iVar1;
  DdManager *dd;
  abctime aVar2;
  void *pvVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  DdNode *pDVar6;
  Aig_Man_t *pAVar7;
  DdNode *pDVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  Aig_Obj_t *pNode;
  int iVar11;
  long lVar12;
  DdNode *f;
  
  dd = p->dd;
  if (vHints == (Vec_Int_t *)0x0) {
    pDVar6 = Cudd_ReadOne(dd);
    return pDVar6;
  }
  aVar2 = dd->TimeStop;
  dd->TimeStop = 0;
  if (p->pAig->nObjs[2] != p->pAigGlo->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p->pAig) == Aig_ManCiNum(p->pAigGlo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                  ,0x1a5,"DdNode *Llb_ManCreateConstraints(Llb_Man_t *, Vec_Int_t *, int)");
  }
  Aig_ManCleanData(p->pAig);
  pDVar6 = Cudd_ReadOne(p->dd);
  (p->pAig->pConst1->field_5).pData = pDVar6;
  pAVar7 = p->pAig;
  if (0 < pAVar7->nTruePis) {
    lVar12 = 0;
    do {
      if (pAVar7->vCis->nSize <= lVar12) goto LAB_0081c98b;
      pvVar3 = pAVar7->vCis->pArray[lVar12];
      iVar11 = *(int *)((long)pvVar3 + 0x24);
      if (((long)iVar11 < 0) || (p->vObj2Var->nSize <= iVar11)) goto LAB_0081c9aa;
      pDVar6 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[iVar11]);
      *(DdNode **)((long)pvVar3 + 0x28) = pDVar6;
      lVar12 = lVar12 + 1;
      pAVar7 = p->pAig;
    } while (lVar12 < pAVar7->nTruePis);
  }
  pAVar7 = p->pAig;
  if (0 < pAVar7->nRegs) {
    iVar11 = 0;
    do {
      iVar1 = pAVar7->nTruePis;
      uVar10 = iVar11 + iVar1;
      if (((int)uVar10 < 0) || (pAVar7->vCis->nSize <= (int)uVar10)) goto LAB_0081c98b;
      piVar4 = (int *)pAVar7->vCis->pArray[uVar10];
      if (fUseNsVars == 0) {
        uVar10 = piVar4[9];
      }
      else {
        if (((piVar4[6] & 7U) != 2) || (*piVar4 < iVar1)) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar10 = (*piVar4 - iVar1) + pAVar7->nTruePos;
        if (((int)uVar10 < 0) || (pAVar7->vCos->nSize <= (int)uVar10)) goto LAB_0081c98b;
        uVar10 = *(uint *)((long)pAVar7->vCos->pArray[uVar10] + 0x24);
      }
      if (((int)uVar10 < 0) || (p->vObj2Var->nSize <= (int)uVar10)) {
LAB_0081c9aa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar6 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[uVar10]);
      *(DdNode **)(piVar4 + 10) = pDVar6;
      iVar11 = iVar11 + 1;
      pAVar7 = p->pAig;
    } while (iVar11 < pAVar7->nRegs);
  }
  Aig_ManCleanData(p->pAigGlo);
  pDVar6 = Cudd_ReadOne(p->dd);
  (p->pAigGlo->pConst1->field_5).pData = pDVar6;
  pVVar9 = p->pAigGlo->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pVVar5 = p->pAig->vCis;
      if (pVVar5->nSize <= lVar12) goto LAB_0081c98b;
      *(undefined8 *)((long)pVVar9->pArray[lVar12] + 0x28) =
           *(undefined8 *)((long)pVVar5->pArray[lVar12] + 0x28);
      lVar12 = lVar12 + 1;
      pVVar9 = p->pAigGlo->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  pDVar6 = Cudd_ReadOne(p->dd);
  Cudd_Ref(pDVar6);
  if (0 < vHints->nSize) {
    lVar12 = 0;
    f = pDVar6;
    do {
      uVar10 = vHints->pArray[lVar12];
      pDVar6 = f;
      if ((ulong)uVar10 < 2) {
        pVVar9 = p->pAigGlo->vObjs;
        if (pVVar9 == (Vec_Ptr_t *)0x0) {
          pNode = (Aig_Obj_t *)0x0;
        }
        else {
          if (pVVar9->nSize <= lVar12) {
LAB_0081c98b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pNode = (Aig_Obj_t *)pVVar9->pArray[lVar12];
        }
        pDVar8 = Llb_ManConstructOutBdd(p->pAigGlo,pNode,p->dd);
        Cudd_Ref(pDVar8);
        pDVar8 = (DdNode *)((ulong)uVar10 ^ (ulong)pDVar8);
        pDVar6 = Cudd_bddAnd(p->dd,f,pDVar8);
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(p->dd,f);
        Cudd_RecursiveDeref(p->dd,pDVar8);
      }
      lVar12 = lVar12 + 1;
      f = pDVar6;
    } while (lVar12 < vHints->nSize);
  }
  Cudd_Deref(pDVar6);
  p->dd->TimeStop = aVar2;
  return pDVar6;
}

Assistant:

DdNode * Llb_ManCreateConstraints( Llb_Man_t * p, Vec_Int_t * vHints, int fUseNsVars )
{
    DdNode * bConstr, * bFunc, * bTemp;
    Aig_Obj_t * pObj;
    int i, Entry;
    abctime TimeStop;
    if ( vHints == NULL )
        return Cudd_ReadOne( p->dd );
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    assert( Aig_ManCiNum(p->pAig) == Aig_ManCiNum(p->pAigGlo) );
    // assign const and PI nodes to the original AIG
    Aig_ManCleanData( p->pAig );
    Aig_ManConst1( p->pAig )->pData = Cudd_ReadOne( p->dd );
    Saig_ManForEachPi( p->pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var,Aig_ObjId(pObj)) );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( fUseNsVars )
            Entry = Vec_IntEntry( p->vObj2Var, Aig_ObjId(Saig_ObjLoToLi(p->pAig, pObj)) );
        else
            Entry = Vec_IntEntry( p->vObj2Var, Aig_ObjId(pObj) );
        pObj->pData = Cudd_bddIthVar( p->dd, Entry );
    }
    // transfer them to the global AIG
    Aig_ManCleanData( p->pAigGlo );
    Aig_ManConst1( p->pAigGlo )->pData = Cudd_ReadOne( p->dd );
    Aig_ManForEachCi( p->pAigGlo, pObj, i )
        pObj->pData = Aig_ManCi(p->pAig, i)->pData;
    // derive consraints
    bConstr = Cudd_ReadOne( p->dd );   Cudd_Ref( bConstr );
    Vec_IntForEachEntry( vHints, Entry, i )
    {
        if ( Entry != 0 && Entry != 1 )
            continue;
        bFunc = Llb_ManConstructOutBdd( p->pAigGlo, Aig_ManObj(p->pAigGlo, i), p->dd );  Cudd_Ref( bFunc );
        bFunc = Cudd_NotCond( bFunc, Entry ); // restrict to not constraint
        // make the product
        bConstr = Cudd_bddAnd( p->dd, bTemp = bConstr, bFunc );                          Cudd_Ref( bConstr );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bFunc );
    }
    Cudd_Deref( bConstr );
    p->dd->TimeStop = TimeStop;
    return bConstr;
}